

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::Maximum(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                  uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
                  uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  long lVar10;
  byte bVar11;
  SIMDType SVar12;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  byte *pbVar13;
  uchar *puVar14;
  byte *pbVar15;
  undefined4 in_register_0000008c;
  uint uVar16;
  uint uVar17;
  uchar *puVar18;
  uchar *puVar19;
  long lVar20;
  byte *pbVar21;
  uint local_cc;
  uint32_t local_b0;
  uint local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_0000008c,startY2);
  local_a8 = CONCAT44(in_register_00000014,startY1);
  local_98 = (ulong)height;
  local_90 = (ulong)startYOut;
  do {
    SVar12 = simdType;
    bVar11 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                       (in1,in2,out);
    local_b0 = (uint32_t)local_98;
    if (SVar12 != avx_function) {
      if (SVar12 - sse_function < 2) {
        local_cc = 0x10;
        if (0xf < bVar11 * width) goto LAB_00124f8b;
      }
      else if (SVar12 != cpu_function) {
        local_cc = 0;
        goto LAB_00124f8b;
      }
      Image_Function::Maximum
                (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
                 startYOut,width,height);
      return;
    }
    simdType = sse_function;
  } while (bVar11 * width < 0x20);
  local_cc = 0x20;
LAB_00124f8b:
  uVar16 = (uint)bVar11;
  local_88 = in1;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
             (uint32_t)local_90,width,local_b0);
  local_ac = width * uVar16;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_ac,&local_b0,local_88,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar3 = in1->_rowSize;
  uVar4 = in2->_rowSize;
  uVar5 = out->_rowSize;
  uVar17 = local_b0 * uVar5;
  uVar6 = (ulong)local_ac / (ulong)local_cc;
  uVar7 = (ulong)local_ac % (ulong)local_cc;
  puVar19 = in1->_data + (ulong)(startX1 * uVar16) + (ulong)((int)local_a8 * uVar3);
  puVar14 = in2->_data + (ulong)(startX2 * uVar16) + (ulong)((int)local_a0 * uVar4);
  puVar18 = out->_data + (ulong)(startXOut * uVar16) + (ulong)((int)local_90 * uVar5);
  puVar1 = puVar18 + uVar17;
  uVar16 = (int)uVar6 * local_cc;
  if (SVar12 == sse_function) {
    if (uVar17 != 0) {
      do {
        if (local_cc <= local_ac) {
          lVar20 = 0;
          do {
            lVar10 = lVar20 + 0x10;
            auVar8 = vpmaxub_avx(*(undefined1 (*) [16])(puVar19 + lVar10 + -0x10),
                                 *(undefined1 (*) [16])(puVar14 + lVar20));
            *(undefined1 (*) [16])(puVar18 + lVar20) = auVar8;
            lVar20 = lVar20 + 0x10;
          } while (puVar19 + lVar10 != puVar19 + uVar6 * 0x10);
        }
        if (local_ac != uVar16) {
          pbVar21 = puVar18 + uVar16;
          pbVar15 = puVar14 + uVar16;
          pbVar13 = puVar19 + uVar16;
          pbVar2 = pbVar21 + uVar7;
          do {
            bVar11 = *pbVar13;
            if (*pbVar13 < *pbVar15) {
              bVar11 = *pbVar15;
            }
            pbVar13 = pbVar13 + 1;
            pbVar15 = pbVar15 + 1;
            *pbVar21 = bVar11;
            pbVar21 = pbVar21 + 1;
          } while (pbVar21 != pbVar2);
        }
        puVar19 = puVar19 + uVar3;
        puVar18 = puVar18 + uVar5;
        puVar14 = puVar14 + uVar4;
      } while (puVar18 != puVar1);
    }
  }
  else if ((SVar12 == avx_function) && (uVar17 != 0)) {
    do {
      if (local_cc <= local_ac) {
        lVar20 = 0;
        do {
          lVar10 = lVar20 + 0x20;
          auVar9 = vpmaxub_avx2(*(undefined1 (*) [32])(puVar19 + lVar10 + -0x20),
                                *(undefined1 (*) [32])(puVar14 + lVar20));
          *(undefined1 (*) [32])(puVar18 + lVar20) = auVar9;
          lVar20 = lVar20 + 0x20;
        } while (puVar19 + lVar10 != puVar19 + uVar6 * 0x20);
      }
      if (local_ac != uVar16) {
        pbVar21 = puVar18 + uVar16;
        pbVar15 = puVar14 + uVar16;
        pbVar13 = puVar19 + uVar16;
        pbVar2 = pbVar21 + uVar7;
        do {
          bVar11 = *pbVar13;
          if (*pbVar13 < *pbVar15) {
            bVar11 = *pbVar15;
          }
          pbVar13 = pbVar13 + 1;
          pbVar15 = pbVar15 + 1;
          *pbVar21 = bVar11;
          pbVar21 = pbVar21 + 1;
        } while (pbVar21 != pbVar2);
      }
      puVar19 = puVar19 + uVar3;
      puVar18 = puVar18 + uVar5;
      puVar14 = puVar14 + uVar4;
    } while (puVar18 != puVar1);
  }
  return;
}

Assistant:

void Maximum( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( Maximum( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::Maximum( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Maximum( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Maximum( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Maximum( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }